

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O0

void VP8LCollectColorBlueTransforms_C
               (uint32_t *argb,int stride,int tile_width,int tile_height,int green_to_blue,
               int red_to_blue,int *histo)

{
  byte bVar1;
  int in_ECX;
  int iVar2;
  int in_EDX;
  undefined4 in_R9D;
  int x;
  uint32_t argb_00;
  undefined4 local_14;
  
  local_14 = in_ECX;
  while (iVar2 = local_14 + -1, 0 < local_14) {
    for (argb_00 = 0; local_14 = iVar2, (int)argb_00 < in_EDX; argb_00 = argb_00 + 1) {
      bVar1 = TransformColorBlue((uint8_t)((uint)in_R9D >> 0x18),(uint8_t)((uint)in_R9D >> 0x10),
                                 argb_00);
      *(int *)(CONCAT44(red_to_blue,x) + (ulong)bVar1 * 4) =
           *(int *)(CONCAT44(red_to_blue,x) + (ulong)bVar1 * 4) + 1;
    }
  }
  return;
}

Assistant:

void VP8LCollectColorBlueTransforms_C(const uint32_t* argb, int stride,
                                      int tile_width, int tile_height,
                                      int green_to_blue, int red_to_blue,
                                      int histo[]) {
  while (tile_height-- > 0) {
    int x;
    for (x = 0; x < tile_width; ++x) {
      ++histo[TransformColorBlue((uint8_t)green_to_blue, (uint8_t)red_to_blue,
                                 argb[x])];
    }
    argb += stride;
  }
}